

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmimeprovider.cpp
# Opt level: O2

QString * __thiscall
QMimeBinaryProvider::genericIcon
          (QString *__return_storage_ptr__,QMimeBinaryProvider *this,QString *name)

{
  QMimeBinaryProvider *this_00;
  long in_FS_OFFSET;
  QLatin1StringView latin1;
  Data *local_38;
  QMimeDatabasePrivate *pQStack_30;
  Data *local_28;
  char16_t *local_20;
  
  this_00 = (QMimeBinaryProvider *)&stack0xffffffffffffffc8;
  local_20 = *(char16_t **)(in_FS_OFFSET + 0x28);
  local_28 = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_38 = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  pQStack_30 = (QMimeDatabasePrivate *)&DAT_aaaaaaaaaaaaaaaa;
  QString::toLatin1_helper((QByteArray *)&stack0xffffffffffffffc8,name);
  latin1 = iconForMime(this_00,(this->m_cacheFile)._M_t.
                               super___uniq_ptr_impl<QMimeBinaryProvider::CacheFile,_std::default_delete<QMimeBinaryProvider::CacheFile>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_QMimeBinaryProvider::CacheFile_*,_std::default_delete<QMimeBinaryProvider::CacheFile>_>
                               .super__Head_base<0UL,_QMimeBinaryProvider::CacheFile_*,_false>.
                               _M_head_impl,0x24,(QByteArray *)&stack0xffffffffffffffc8);
  QString::QString(__return_storage_ptr__,latin1);
  QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&stack0xffffffffffffffc8);
  if (*(char16_t **)(in_FS_OFFSET + 0x28) == local_20) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QMimeBinaryProvider::genericIcon(const QString &name)
{
    const QByteArray inputMime = name.toLatin1();
    return iconForMime(m_cacheFile.get(), PosGenericIconsListOffset, inputMime);
}